

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O0

void __thiscall Ptex::v2_2::PtexSeparableKernel::mergeR(PtexSeparableKernel *this,BorderMode mode)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float *p;
  int in_ESI;
  Res *in_RDI;
  float fVar4;
  float *kp;
  int w;
  
  iVar1 = *(int *)(in_RDI + 6);
  iVar2 = *(int *)(in_RDI + 2);
  iVar3 = Res::u(in_RDI);
  iVar3 = (iVar1 + iVar2) - iVar3;
  p = (float *)(*(long *)(in_RDI + 0xc) + (long)*(int *)(in_RDI + 6) * 4 + (long)iVar3 * -4);
  if (in_ESI != 1) {
    fVar4 = accumulate(p,iVar3);
    p[-1] = fVar4 + p[-1];
  }
  *(int *)(in_RDI + 6) = *(int *)(in_RDI + 6) - iVar3;
  return;
}

Assistant:

void mergeR(BorderMode mode)
    {
        int w = uw + u - res.u();
        float* kp = ku + uw - w;
        if (mode != m_black)
            kp[-1] += accumulate(kp, w);
        uw -= w;
    }